

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::ConstraintException::
ConstraintException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
          (ConstraintException *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_3)

{
  _Alloc_hider in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  string local_48;
  
  ::std::__cxx11::string::string((string *)&local_68,(string *)params);
  ::std::__cxx11::string::string((string *)&local_88,(string *)params_1);
  ::std::__cxx11::string::string((string *)&local_a8,(string *)params_2);
  ::std::__cxx11::string::string((string *)&stack0xffffffffffffff38,(string *)params_3);
  Exception::
  ConstructMessage<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (&local_48,(Exception *)msg,&local_68,&local_88,&local_a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff38._M_p);
  ConstraintException(this,&local_48);
  ::std::__cxx11::string::~string((string *)&local_48);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
  ::std::__cxx11::string::~string((string *)&local_a8);
  ::std::__cxx11::string::~string((string *)&local_88);
  ::std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

explicit ConstraintException(const string &msg, ARGS... params)
	    : ConstraintException(ConstructMessage(msg, params...)) {
	}